

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall SWDSimulationDataGenerator::OutputLineReset(SWDSimulationDataGenerator *this)

{
  undefined4 local_14;
  int cnt;
  SWDSimulationDataGenerator *this_local;
  
  for (local_14 = 0; local_14 < 0x37; local_14 = local_14 + 1) {
    OutputWriteBit(this,BIT_HIGH);
  }
  for (local_14 = 0; local_14 < 10; local_14 = local_14 + 1) {
    OutputWriteBit(this,BIT_LOW);
  }
  AdvanceAllBySec(this,4.9999999999999996e-06);
  return;
}

Assistant:

void SWDSimulationDataGenerator::OutputLineReset()
{
    int cnt;

    // 55 ones
    for( cnt = 0; cnt < 55; ++cnt )
        OutputWriteBit( BIT_HIGH );

    // 10 zeros
    for( cnt = 0; cnt < 10; ++cnt )
        OutputWriteBit( BIT_LOW );

    // pause
    AdvanceAllBySec( TENTH_US * 50 );
}